

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O3

void eddsa_freekey(ssh_key *key)

{
  if (key[-2].vt != (ssh_keyalg *)0x0) {
    ecc_edwards_point_free((EdwardsPoint *)key[-2].vt);
  }
  if (key[-1].vt != (ssh_keyalg *)0x0) {
    mp_free((mp_int *)key[-1].vt);
  }
  safefree(key + -3);
  return;
}

Assistant:

static void eddsa_freekey(ssh_key *key)
{
    struct eddsa_key *ek = container_of(key, struct eddsa_key, sshk);

    if (ek->publicKey)
        ecc_edwards_point_free(ek->publicKey);
    if (ek->privateKey)
        mp_free(ek->privateKey);
    sfree(ek);
}